

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::isExtensionSupported
               (Context *context,string *extensionName)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *pNVar2;
  allocator<char> local_9a;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = std::operator==(extensionName,"GL_EXT_draw_buffers_indexed");
  if ((!bVar1) && (bVar1 = std::operator==(extensionName,"GL_KHR_blend_equation_advanced"), !bVar1))
  {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (context->m_contextInfo,(extensionName->_M_dataplus)._M_p);
    if (bVar1) {
      return;
    }
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Extension ",&local_99);
    std::operator+(&local_58,&local_78,extensionName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98," not supported.",&local_9a);
    std::operator+(&local_38,&local_58,&local_98);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,local_38._M_dataplus._M_p,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
               ,0x4a);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ctxType.super_ApiType.m_bits = (ApiType)(*context->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar1) &&
     (bVar1 = glu::ContextInfo::isExtensionSupported
                        (context->m_contextInfo,(extensionName->_M_dataplus)._M_p), !bVar1)) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Extension ",&local_99);
    std::operator+(&local_58,&local_78,extensionName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98," not supported.",&local_9a);
    std::operator+(&local_38,&local_58,&local_98);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,local_38._M_dataplus._M_p,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
               ,0x47);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void isExtensionSupported (Context& context, std::string extensionName)
{
	if (extensionName == "GL_EXT_draw_buffers_indexed" || extensionName == "GL_KHR_blend_equation_advanced")
	{
		if (!contextSupports(context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !context.getContextInfo().isExtensionSupported(extensionName.c_str()))
			TCU_THROW(NotSupportedError, (std::string("Extension ") + extensionName + std::string(" not supported.")).c_str());
	}
	else if (!context.getContextInfo().isExtensionSupported(extensionName.c_str()))
		TCU_THROW(NotSupportedError, (std::string("Extension ") + extensionName + std::string(" not supported.")).c_str());
}